

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::Stats::getMatrixAverage(Stats *this,int index)

{
  reference pvVar1;
  MatrixAccumulator *this_00;
  int in_EDX;
  long in_RSI;
  Mat3x3d *in_RDI;
  Mat3x3d *value;
  ResultType *in_stack_ffffffffffffffa8;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2f3573);
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  if (pvVar1->accumulator == (BaseAccumulator *)0x0) {
    this_00 = (MatrixAccumulator *)0x0;
  }
  else {
    this_00 = (MatrixAccumulator *)
              __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,
                             &MatrixAccumulator::typeinfo,0);
  }
  MatrixAccumulator::getAverage(this_00,in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

Mat3x3d Stats::getMatrixAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Mat3x3d value;
    dynamic_cast<MatrixAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }